

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::setRecordRunInfo(Amr *this,string *filename)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  long in_RDI;
  allocator local_31;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  
  *(undefined4 *)(in_RDI + 0x2c8) = 1;
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    _Var2 = std::__cxx11::string::c_str();
    std::operator|(_S_out,_S_app);
    std::ofstream::open((char *)(in_RDI + 0x4d0),_Var2);
    uVar3 = std::ios::good();
    if ((uVar3 & 1) == 0) {
      FileOpenFailed(in_stack_ffffffffffffffd8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Amr::setRecordRunInfo",&local_31);
  ParallelDescriptor::Barrier((string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void
Amr::setRecordRunInfo (const std::string& filename)
{
    record_run_info = true;
    if (ParallelDescriptor::IOProcessor())
    {
        runlog.open(filename.c_str(),std::ios::out|std::ios::app);
        if (!runlog.good())
            amrex::FileOpenFailed(filename);
    }
    ParallelDescriptor::Barrier("Amr::setRecordRunInfo");
}